

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_690ada::CCoinsViewCacheTest::SelfTest
          (CCoinsViewCacheTest *this,bool sanity_check)

{
  PoolResource<144UL,_8UL> *pPVar1;
  uint uVar2;
  ResourceType *pool_resource;
  _Hash_node_base *p_Var3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  size_t local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  lazy_ostream local_100;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  ulong local_c0;
  size_t local_b8;
  ulong *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  ulong **local_90;
  size_t *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  size_t **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = (this->super_CCoinsViewCache).cacheCoins._M_h.
           super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
           .
           super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
           ._M_tp.m_resource;
  uVar9 = (this->super_CCoinsViewCache).cacheCoins._M_h._M_bucket_count;
  sVar8 = pPVar1->m_chunk_size_bytes;
  lVar4 = 0x30;
  if (sVar8 != 0) {
    lVar4 = (sVar8 + 0x1f & 0xfffffffffffffff0) + 0x30;
  }
  uVar7 = uVar9 * 8 + 0x1f & 0xfffffffffffffff0;
  if ((uVar9 & 0x1fffffffffffffff) == 0) {
    uVar7 = 0;
  }
  sVar8 = uVar7 + lVar4 * (pPVar1->m_allocated_chunks).
                          super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
                          _M_node._M_size;
  uVar9 = 0;
  for (p_Var3 = (this->super_CCoinsViewCache).cacheCoins._M_h._M_before_begin._M_nxt;
      p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
    uVar2 = *(uint *)&p_Var3[0xb]._M_nxt;
    if (*(uint *)((long)&p_Var3[0xd]._M_nxt + 4) < 0x1d) {
      uVar2 = 0;
    }
    uVar7 = 0;
    if (uVar2 != 0) {
      uVar7 = (ulong)uVar2 + 0x1f & 0xfffffffffffffff0;
    }
    sVar8 = sVar8 + uVar7;
    uVar9 = uVar9 + 1;
  }
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5f;
  file.m_begin = (iterator)&local_d0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_c0 = uVar9;
  local_b8 = sVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  uVar2 = CCoinsViewCache::GetCacheSize(&this->super_CCoinsViewCache);
  local_88 = &local_128;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar9 == uVar2);
  local_128 = CONCAT44(local_128._4_4_,uVar2);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_58 = "";
  local_68 = &local_88;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01388f88;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_c0;
  local_90 = &local_b0;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_01388f48;
  local_98 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_100,1,2,REQUIRE,0xf568b3,(size_t)&local_60,0x5f,&local_80,"count",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x60;
  file_00.m_begin = (iterator)&local_110;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_128 = CCoinsViewCache::DynamicMemoryUsage(&this->super_CCoinsViewCache);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_128 == sVar8);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_128;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_b8;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_01388f48;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_100,1,2,REQUIRE,0xf57038,(size_t)&local_60,0x60,&local_80,"ret",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (sanity_check) {
    CCoinsViewCache::SanityCheck(&this->super_CCoinsViewCache);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelfTest(bool sanity_check = true) const
    {
        // Manually recompute the dynamic usage of the whole data, and compare it.
        size_t ret = memusage::DynamicUsage(cacheCoins);
        size_t count = 0;
        for (const auto& entry : cacheCoins) {
            ret += entry.second.coin.DynamicMemoryUsage();
            ++count;
        }
        BOOST_CHECK_EQUAL(GetCacheSize(), count);
        BOOST_CHECK_EQUAL(DynamicMemoryUsage(), ret);
        if (sanity_check) {
            SanityCheck();
        }
    }